

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_mcode.c
# Opt level: O0

void mcode_allocarea(jit_State *J)

{
  ulong uVar1;
  void *pvVar2;
  uint8_t *puVar3;
  size_t in_RDI;
  size_t sz;
  MCode *oldarea;
  size_t in_stack_00000018;
  jit_State *in_stack_00000020;
  
  puVar3 = *(uint8_t **)(in_RDI + 0x9c8);
  uVar1 = (long)*(int *)(in_RDI + 0x678) * 0x400 + 0xfffU & 0xfffffffffffff000;
  pvVar2 = mcode_alloc(in_stack_00000020,in_stack_00000018);
  *(void **)(in_RDI + 0x9c8) = pvVar2;
  *(ulong *)(in_RDI + 0x9e0) = uVar1;
  *(undefined4 *)(in_RDI + 0x9c4) = 3;
  *(long *)(in_RDI + 0x9d0) = *(long *)(in_RDI + 0x9c8) + *(long *)(in_RDI + 0x9e0);
  *(long *)(in_RDI + 0x9d8) = *(long *)(in_RDI + 0x9c8) + 0x10;
  **(undefined8 **)(in_RDI + 0x9c8) = puVar3;
  *(ulong *)(*(long *)(in_RDI + 0x9c8) + 8) = uVar1;
  *(ulong *)(in_RDI + 0x9e8) = uVar1 + *(long *)(in_RDI + 0x9e8);
  puVar3 = lj_err_register_mcode((void *)sz,in_RDI,puVar3);
  *(uint8_t **)(in_RDI + 0x9d8) = puVar3;
  return;
}

Assistant:

static void mcode_allocarea(jit_State *J)
{
  MCode *oldarea = J->mcarea;
  size_t sz = (size_t)J->param[JIT_P_sizemcode] << 10;
  sz = (sz + LJ_PAGESIZE-1) & ~(size_t)(LJ_PAGESIZE - 1);
  J->mcarea = (MCode *)mcode_alloc(J, sz);
  J->szmcarea = sz;
  J->mcprot = MCPROT_GEN;
  J->mctop = (MCode *)((char *)J->mcarea + J->szmcarea);
  J->mcbot = (MCode *)((char *)J->mcarea + sizeof(MCLink));
  ((MCLink *)J->mcarea)->next = oldarea;
  ((MCLink *)J->mcarea)->size = sz;
  J->szallmcarea += sz;
  J->mcbot = (MCode *)lj_err_register_mcode(J->mcarea, sz, (uint8_t *)J->mcbot);
}